

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImU32 ImGui::GetColorU32(ImU32 col)

{
  float fVar1;
  
  fVar1 = (GImGui->Style).Alpha;
  if (fVar1 < 1.0) {
    col = (int)(long)(fVar1 * (float)(col >> 0x18)) << 0x18 | col & 0xffffff;
  }
  return col;
}

Assistant:

ImU32 ImGui::GetColorU32(ImU32 col)
{
    float style_alpha = GImGui->Style.Alpha;
    if (style_alpha >= 1.0f)
        return col;
    ImU32 a = (col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT;
    a = (ImU32)(a * style_alpha); // We don't need to clamp 0..255 because Style.Alpha is in 0..1 range.
    return (col & ~IM_COL32_A_MASK) | (a << IM_COL32_A_SHIFT);
}